

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamState.cpp
# Opt level: O0

void __thiscall
TasDREAM::TasmanianDREAM::getApproximateMode
          (TasmanianDREAM *this,vector<double,_std::allocator<double>_> *mode)

{
  unsigned_long __n;
  const_iterator __first;
  difference_type dVar1;
  double *__result;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  double *local_30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_20;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> imax;
  vector<double,_std::allocator<double>_> *mode_local;
  TasmanianDREAM *this_local;
  
  imax._M_current = (double *)mode;
  local_28._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->pdf_history);
  local_30 = (double *)std::vector<double,_std::allocator<double>_>::end(&this->pdf_history);
  local_20 = std::
             max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                       (local_28,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                  )local_30);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)imax._M_current,this->num_dimensions);
  local_40._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(&this->history);
  __first = std::vector<double,_std::allocator<double>_>::begin(&this->pdf_history);
  dVar1 = std::
          distance<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      )__first._M_current,local_20);
  local_38 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+(&local_40,dVar1 * this->num_dimensions);
  __n = this->num_dimensions;
  __result = std::vector<double,_std::allocator<double>_>::data(imax._M_current);
  std::
  copy_n<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,unsigned_long,double*>
            (local_38,__n,__result);
  return;
}

Assistant:

void TasmanianDREAM::getApproximateMode(std::vector<double> &mode) const{
    auto imax = std::max_element(pdf_history.begin(), pdf_history.end());
    mode.resize(num_dimensions);
    std::copy_n(history.begin() + std::distance(pdf_history.begin(), imax) * num_dimensions, num_dimensions, mode.data());
}